

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  StringBaseTextGenerator generator;
  undefined1 local_30 [8];
  _Alloc_hider local_28;
  size_type local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  
  local_28._M_p = (pointer)&local_18;
  local_30 = (undefined1  [8])&PTR__StringBaseTextGenerator_0060d7a0;
  local_20 = 0;
  local_18._M_local_buf[0] = '\0';
  FastFieldValuePrinter::PrintString
            ((FastFieldValuePrinter *)__return_storage_ptr__,val,(BaseTextGenerator *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_28);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintString(
    const std::string& val) const {
  FORWARD_IMPL(PrintString, val);
}